

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O3

bool __thiscall Bipartition::contains(Bipartition *this,Bipartition *e)

{
  bool bVar1;
  bool bVar2;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> foreign;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_40.m_bits,&(e->partition).m_bits);
  local_40.m_num_bits = (e->partition).m_num_bits;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator&=
            (&local_40,&this->partition);
  bVar1 = boost::operator==(&local_40,&e->partition);
  bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_40);
  if (bVar2) {
    if (local_40.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return bVar1;
  }
  __assert_fail("m_check_invariants()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                ,0x279,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

bool Bipartition::contains(const Bipartition& e) const {
    auto foreign = e.partition;
    foreign &= partition;
    return foreign == e.partition;
}